

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void funcinfo(lua_Debug *ar,Closure *cl)

{
  Proto *pPVar1;
  char *pcVar2;
  char **local_28;
  Proto *p;
  Closure *cl_local;
  lua_Debug *ar_local;
  
  if ((cl == (Closure *)0x0) || ((cl->c).tt != '\x06')) {
    ar->source = "=[C]";
    ar->srclen = 4;
    ar->linedefined = -1;
    ar->lastlinedefined = -1;
    ar->what = "C";
  }
  else {
    pPVar1 = (cl->l).p;
    if (pPVar1->source == (TString *)0x0) {
      ar->source = "=?";
      ar->srclen = 2;
    }
    else {
      if (pPVar1->source->shrlen < '\0') {
        ar->srclen = (size_t)pPVar1->source->u;
        local_28 = (char **)pPVar1->source->contents;
      }
      else {
        ar->srclen = (long)pPVar1->source->shrlen;
        local_28 = &pPVar1->source->contents;
      }
      ar->source = (char *)local_28;
    }
    ar->linedefined = pPVar1->linedefined;
    ar->lastlinedefined = pPVar1->lastlinedefined;
    pcVar2 = "Lua";
    if (ar->linedefined == 0) {
      pcVar2 = "main";
    }
    ar->what = pcVar2;
  }
  luaO_chunkid(ar->short_src,ar->source,ar->srclen);
  return;
}

Assistant:

static void funcinfo (lua_Debug *ar, Closure *cl) {
  if (!LuaClosure(cl)) {
    ar->source = "=[C]";
    ar->srclen = LL("=[C]");
    ar->linedefined = -1;
    ar->lastlinedefined = -1;
    ar->what = "C";
  }
  else {
    const Proto *p = cl->l.p;
    if (p->source) {
      ar->source = getlstr(p->source, ar->srclen);
    }
    else {
      ar->source = "=?";
      ar->srclen = LL("=?");
    }
    ar->linedefined = p->linedefined;
    ar->lastlinedefined = p->lastlinedefined;
    ar->what = (ar->linedefined == 0) ? "main" : "Lua";
  }
  luaO_chunkid(ar->short_src, ar->source, ar->srclen);
}